

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.t.cpp
# Opt level: O0

ostream * __thiscall
dynamicgraph::
Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
display(Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
        *this,ostream *os)

{
  ostream *poVar1;
  ostream *os_local;
  Signal<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  *this_local;
  
  poVar1 = std::operator<<(os,"Sig:");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_SignalBase<int>).name);
  std::operator<<(poVar1," (Type ");
  switch(this->signalType) {
  case CONSTANT:
    std::operator<<(os,"Cst");
    break;
  case REFERENCE:
    std::operator<<(os,"Ref");
    break;
  case REFERENCE_NON_CONST:
    std::operator<<(os,"RefNonCst");
    break;
  case FUNCTION:
    std::operator<<(os,"Fun");
  }
  poVar1 = std::operator<<(os,")");
  return poVar1;
}

Assistant:

std::ostream &Signal<T, Time>::display(std::ostream &os) const {
  os << "Sig:" << this->name << " (Type ";
  switch (this->signalType) {
    case Signal<T, Time>::CONSTANT:
      os << "Cst";
      break;
    case Signal<T, Time>::REFERENCE:
      os << "Ref";
      break;
    case Signal<T, Time>::REFERENCE_NON_CONST:
      os << "RefNonCst";
      break;
    case Signal<T, Time>::FUNCTION:
      os << "Fun";
      break;
  }
  return os << ")";
}